

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

object_ptr __thiscall
mjs::interpreter::impl::create_function
          (impl *this,string *id,shared_ptr<mjs::block_statement> *block,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *param_names,wstring *body_text,scope_ptr *prev_scope)

{
  gc_heap *h;
  function_object *pfVar1;
  uint *puVar2;
  wstring *pwVar3;
  statement *extraout_RDX;
  statement *extraout_RDX_00;
  statement *extraout_RDX_01;
  statement *extraout_RDX_02;
  statement *s;
  undefined8 extraout_RDX_03;
  object_ptr oVar4;
  gc_heap_ptr<mjs::function_object> callee;
  anon_class_144_7_2443f645_for_f func;
  gc_heap_ptr_untyped local_180;
  impl *local_170;
  gc_heap_ptr_untyped local_168;
  undefined1 local_158 [24];
  uint32_t local_140;
  gc_heap_ptr_untyped local_138;
  long *local_128 [2];
  long local_118 [2];
  wstring *local_108;
  gc_heap_ptr_untyped local_100;
  long *local_f0 [2];
  long local_e0 [2];
  anon_class_144_7_2443f645_for_f local_d0;
  wstring_view local_40;
  
  local_170 = this;
  make_raw_function((mjs *)&local_180,(gc_heap_ptr<mjs::global_object> *)(id + 2));
  local_d0.block.super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (param_names->
       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_d0.block.super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          (param_names->
          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish;
  if ((pointer)local_d0.block.super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((pointer)
               local_d0.block.super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_string_length =
           (int)((pointer)
                local_d0.block.super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&((pointer)
               local_d0.block.super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_string_length =
           (int)((pointer)
                local_d0.block.super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_string_length + 1;
    }
  }
  local_d0.this = (impl *)id;
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(&local_d0.param_names,
           (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)body_text);
  local_d0.prev_scope.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)((callee.super_gc_heap_ptr_untyped.heap_)->pointers_).set_;
  local_d0.prev_scope.super_gc_heap_ptr_untyped.pos_ =
       ((callee.super_gc_heap_ptr_untyped.heap_)->pointers_).capacity_;
  s = extraout_RDX;
  if (local_d0.prev_scope.super_gc_heap_ptr_untyped.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_d0.prev_scope.super_gc_heap_ptr_untyped.heap_,
                    &local_d0.prev_scope.super_gc_heap_ptr_untyped);
    s = extraout_RDX_00;
  }
  local_d0.callee.super_gc_heap_ptr_untyped.heap_ = local_180.heap_;
  local_d0.callee.super_gc_heap_ptr_untyped.pos_ = local_180.pos_;
  local_108 = body_text;
  if (local_180.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_180.heap_,&local_d0.callee.super_gc_heap_ptr_untyped);
    s = extraout_RDX_01;
  }
  local_d0.id.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)
       (block->super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d0.id.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
       *(uint32_t *)
        &(block->super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
  if (local_d0.id.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
      (gc_heap *)0x0) {
    gc_heap::attach(local_d0.id.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_,
                    (gc_heap_ptr_untyped *)&local_d0.id);
    s = extraout_RDX_02;
  }
  hoisting_visitor::scan_abi_cxx11_
            (&local_d0.hv_result,
             (hoisting_visitor *)
             (param_names->
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,s);
  pfVar1 = (function_object *)gc_heap_ptr_untyped::get(&local_180);
  local_168.heap_ = (gc_heap *)0x0;
  local_168.pos_ = 0;
  h = (id->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
  puVar2 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)block);
  local_128[0] = local_118;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_128,puVar2 + 1,puVar2 + (ulong)*puVar2 + 1);
  pwVar3 = (wstring *)std::__cxx11::wstring::replace((ulong)local_128,0,(wchar_t *)0x0,0x207294);
  std::__cxx11::wstring::wstring((wstring *)local_f0,pwVar3);
  pwVar3 = (wstring *)
           std::__cxx11::wstring::_M_append
                     ((wchar_t *)local_f0,(ulong)(prev_scope->super_gc_heap_ptr_untyped).heap_);
  std::__cxx11::wstring::wstring((wstring *)local_158,pwVar3);
  local_40._M_str = (wchar_t *)local_158._0_8_;
  string::string((string *)&local_100,h,&local_40);
  function_object::
  put_function<mjs::interpreter::impl::create_function(mjs::string_const&,std::shared_ptr<mjs::block_statement>const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>const&,std::__cxx11::wstring_const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&)::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_1_>
            (pfVar1,&local_d0,(gc_heap_ptr<mjs::gc_string> *)&local_168,
             (gc_heap_ptr<mjs::gc_string> *)&local_100,
             (int)(local_108->_M_string_length - (long)(local_108->_M_dataplus)._M_p >> 5));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
  if ((gc_heap *)local_158._0_8_ != (gc_heap *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ * 4 + 4);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] * 4 + 4);
  }
  if (local_128[0] != local_118) {
    operator_delete(local_128[0],local_118[0] * 4 + 4);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_168);
  pfVar1 = (function_object *)gc_heap_ptr_untyped::get(&local_180);
  local_158._0_8_ = id[2].super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
  local_158._8_4_ = id[2].super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  if ((gc_heap *)local_158._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_158._0_8_,(gc_heap_ptr_untyped *)local_158);
  }
  local_158._16_8_ = local_180.heap_;
  local_140 = local_180.pos_;
  if (local_180.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)(local_158 + 0x10));
  }
  local_138.heap_ =
       (gc_heap *)
       (block->super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_138.pos_ =
       *(uint32_t *)
        &(block->super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
  if (local_138.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_138.heap_,&local_138);
  }
  function_object::
  construct_function<mjs::interpreter::impl::create_function(mjs::string_const&,std::shared_ptr<mjs::block_statement>const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>const&,std::__cxx11::wstring_const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&)::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_2_>
            (pfVar1,(anon_class_48_3_9fe6017f_for_f *)local_158);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_138);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_158 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_158);
  local_170->heap_ = local_180.heap_;
  *(uint32_t *)&local_170->strict_mode_ = local_180.pos_;
  if (local_180.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)local_170);
  }
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_d0.hv_result.
             super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
             .
             super__Head_base<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_false>
             ._M_head_impl);
  if (local_d0.hv_result.
      super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
      .
      super__Tuple_impl<1UL,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
      .
      super__Head_base<1UL,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>,_false>
      ._M_head_impl.
      super__Vector_base<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.hv_result.
                    super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                    .
                    super__Tuple_impl<1UL,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                    .
                    super__Head_base<1UL,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>,_false>
                    ._M_head_impl.
                    super__Vector_base<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.hv_result.
                          super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                          .
                          super__Tuple_impl<1UL,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                          .
                          super__Head_base<1UL,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.hv_result.
                          super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                          .
                          super__Tuple_impl<1UL,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                          .
                          super__Head_base<1UL,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_d0.id);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0.callee.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0.prev_scope.super_gc_heap_ptr_untyped);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_d0.param_names);
  if ((pointer)local_d0.block.super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.block.super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
  oVar4.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX_03;
  oVar4.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_170;
  return (object_ptr)oVar4.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr create_function(const string& id, const std::shared_ptr<block_statement>& block, const std::vector<std::wstring>& param_names, const std::wstring& body_text, const scope_ptr& prev_scope) {
        // §15.3.2.1
        auto callee = make_raw_function(global_);
        auto func = [this, block, param_names, prev_scope, callee, id, hv_result = hoisting_visitor::scan(*block)](const value& this_, const std::vector<value>& args) {
            strict_mode_scope sms{*this, block->strict_mode()};
            // Scope
            auto activation = activation_object::make(global_, param_names, args);
            activation->put(global_->common_string("this"), block->strict_mode() ? this_ : get_this_arg(global_, this_), property_attribute::dont_delete | property_attribute::dont_enum | property_attribute::read_only);
            if (!strict_mode_) {
                activation->arguments()->put(global_->common_string("callee"), value{callee}, property_attribute::dont_enum);
            } else {
                global_->define_thrower_accessor(*activation->arguments(), "callee");
                global_->define_thrower_accessor(*activation->arguments(), "caller");
            }
            auto_scope auto_scope_{*this, activation, prev_scope};
            // Variables
            hoist(hv_result);
            if (!id.view().empty()) {
                // Add name of function to activation record even if it's not necessary for function_definition
                // It's needed for function expressions since `a=function x() { x(...); }` is legal, but x isn't added to the containing scope
                // TODO: Should actually be done a separate scope object (See ES3, 13)
                assert(!activation->has_property(id.view())); // TODO: Handle this..
                activation->put(id, value{callee}, property_attribute::dont_delete|property_attribute::read_only);
            }
            return top_level_eval(*block);
        };
        callee->put_function(func, nullptr, string{heap_, L"function " + std::wstring{id.view()} + body_text}.unsafe_raw_get(), static_cast<int>(param_names.size()));

        callee->construct_function([global = global_, callee, id](const value& this_, const std::vector<value>& args) {
            assert(this_.type() == value_type::undefined); (void)this_; // [[maybe_unused]] not working with MSVC here?
            assert(!id.view().empty());
            auto p = callee->get(L"prototype");
            auto o = value{global->heap().make<object>(id, p.type() == value_type::object ? p.object_value() : global->object_prototype())};
            auto r = callee->call(o, args);
            return r.type() == value_type::object ? r : value{o};
        });

        return callee;
    }